

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

ssize_t __thiscall DistanceGraph::read(DistanceGraph *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<Link,_std::allocator<Link>_> *pvVar1;
  size_type extraout_RAX;
  size_type sVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  vector<Link,_std::allocator<Link>_> *v;
  vector<Link,_std::allocator<Link>_> *this_00;
  uint64_t count_1;
  uint64_t s;
  uint64_t count;
  size_type local_38;
  char local_30 [8];
  size_type local_28;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::read(pcVar3,(long)local_30);
  std::__cxx11::string::resize((ulong)&this->name,local_30[0]);
  std::istream::read(pcVar3,(long)(this->name)._M_dataplus._M_p);
  std::istream::read(pcVar3,(long)&local_28);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::resize(&this->links,local_28);
  sVar2 = extraout_RAX;
  if (local_28 != 0) {
    pvVar1 = (this->links).
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->links).
                   super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1;
        this_00 = this_00 + 1) {
      std::istream::read(pcVar3,(long)&local_38);
      std::vector<Link,_std::allocator<Link>_>::resize(this_00,local_38);
      sVar2 = local_38;
      if (local_38 != 0) {
        sVar2 = std::istream::read(pcVar3,(long)(this_00->
                                                super__Vector_base<Link,_std::allocator<Link>_>).
                                                _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return sVar2;
}

Assistant:

void DistanceGraph::read(std::ifstream &input_file) {
    uint64_t s;
    input_file.read((char *) &s, sizeof(s));
    name.resize(s);
    input_file.read((char *) name.data(), name.size());
    sdglib::read_flat_vectorvector(input_file, links);
}